

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  FieldDef *local_20;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  string *out;
  
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  bVar2 = FieldDef::IsScalarOptional(field);
  if (bVar2) {
    BVar1 = (local_20->value).type.base_type;
    if (BVar1 == BASE_TYPE_BOOL) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"false",local_35);
      std::allocator<char>::~allocator(local_35);
    }
    else if (BVar1 == BASE_TYPE_FLOAT || BVar1 == BASE_TYPE_DOUBLE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"0.0",&local_21);
      std::allocator<char>::~allocator(&local_21);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"0",&local_36);
      std::allocator<char>::~allocator(&local_36);
    }
  }
  else {
    GenDefaultValue_abi_cxx11_(__return_storage_ptr__,this,local_20,true);
    if (((local_20->value).type.base_type == BASE_TYPE_FLOAT) &&
       (lVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x41869c), lVar3 != -1)) {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x5);
    }
    pcVar4 = (char *)std::__cxx11::string::back();
    if (*pcVar4 == 'f') {
      std::__cxx11::string::pop_back();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBDefaultValue(const FieldDef &field) const {
    if (field.IsScalarOptional()) {
      // although default value is null, java API forces us to present a real
      // default value for scalars, while adding a field to the buffer. This is
      // not a problem because the default can be representing just by not
      // calling builder.addMyField()
      switch (field.value.type.base_type) {
        case BASE_TYPE_DOUBLE:
        case BASE_TYPE_FLOAT: return "0.0";
        case BASE_TYPE_BOOL: return "false";
        default: return "0";
      }
    }
    auto out = GenDefaultValue(field, true);
    // All FlatBufferBuilder default floating point values are doubles
    if (field.value.type.base_type == BASE_TYPE_FLOAT) {
      if (out.find("Float") != std::string::npos) {
        out.replace(0, 5, "Double");
      }
    }
    // Guarantee all values are doubles
    if (out.back() == 'f') out.pop_back();
    return out;
  }